

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O2

bool __thiscall
yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>::
try_lock_for<long,std::ratio<60l,1l>>
          (basic_shared_timed_mutex<yamc::rwlock::TaskFairness> *this,
          duration<long,_std::ratio<60L,_1L>_> *duration)

{
  bool bVar1;
  long lVar2;
  unique_lock<std::mutex> lk;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tp;
  unique_lock<std::mutex> local_30;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  
  lVar2 = std::chrono::_V2::steady_clock::now();
  local_20.__d.__r = (duration)(duration->__r * 60000000000 + lVar2);
  std::unique_lock<std::mutex>::unique_lock(&local_30,(mutex_type *)(this + 0x60));
  bVar1 = detail::shared_mutex_base<yamc::rwlock::TaskFairness>::
          impl_try_lockwait<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((shared_mutex_base<yamc::rwlock::TaskFairness> *)this,&local_30,&local_20);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return bVar1;
}

Assistant:

bool try_lock_for(const std::chrono::duration<Rep, Period>& duration)
  {
    const auto tp = std::chrono::steady_clock::now() + duration;
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    return base::impl_try_lockwait(lk, tp);
  }